

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,string *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  bool bVar1;
  reference ppTVar2;
  pointer ppVar3;
  string *in_RSI;
  UnitTestFilter *in_RDI;
  UnitTestFilter death_test_suite_filter;
  TestSuite *new_test_suite;
  iterator item_it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
  *in_stack_fffffffffffffea8;
  __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  *in_stack_fffffffffffffeb0;
  UnitTestFilter *pUVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
  *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  allocator *paVar5;
  TestSuite *name;
  __type_conflict2 local_115;
  TearDownTestSuiteFunc in_stack_ffffffffffffff10;
  SetUpTestSuiteFunc in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  TestSuite *in_stack_ffffffffffffff30;
  value_type *in_stack_ffffffffffffff38;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_true>
  local_48 [6];
  TestSuite *local_8;
  
  pUVar4 = in_RDI;
  bVar1 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::empty
                    ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                     in_stack_fffffffffffffec0);
  local_115 = false;
  if (!bVar1) {
    std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
              ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
               in_stack_fffffffffffffeb8);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                 *)in_stack_fffffffffffffeb0);
    local_115 = std::operator==(in_stack_fffffffffffffed0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  }
  if (local_115 == false) {
    local_48[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
         ::find(in_stack_fffffffffffffea8,(key_type *)0x16f5dc);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>_>
         ::end(in_stack_fffffffffffffea8);
    bVar1 = std::__detail::operator!=(local_48,&local_50);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_false,_true>
                             *)0x16f625);
      local_8 = ppVar3->second;
    }
    else {
      local_8 = (TestSuite *)operator_new(0x108);
      TestSuite::TestSuite
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      name = local_8;
      std::
      unordered_map<std::__cxx11::string,testing::TestSuite*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::TestSuite*>>>
      ::emplace<std::__cxx11::string_const&,testing::TestSuite*const&>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 (TestSuite **)in_stack_fffffffffffffeb0);
      paVar5 = (allocator *)&stack0xffffffffffffff17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff18,"*DeathTest:*DeathTest/*",paVar5);
      anon_unknown_35::UnitTestFilter::UnitTestFilter(pUVar4,in_RSI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff17);
      bVar1 = anon_unknown_35::UnitTestFilter::MatchesName(in_RDI,(string *)name);
      if (bVar1) {
        *(int *)((long)&in_RDI[5].exact_match_patterns_._M_h._M_rehash_policy._M_next_resize + 4) =
             *(int *)((long)&in_RDI[5].exact_match_patterns_._M_h._M_rehash_policy._M_next_resize +
                     4) + 1;
        this_00 = &in_RDI[2].exact_match_patterns_;
        std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                  ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                   in_stack_fffffffffffffea8);
        __gnu_cxx::
        __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
        ::operator+((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                     *)this_00,(difference_type)in_stack_fffffffffffffeb0);
        __gnu_cxx::
        __normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
        ::__normal_iterator<testing::TestSuite**>
                  (in_stack_fffffffffffffeb0,
                   (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                    *)in_stack_fffffffffffffea8);
        std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff48,in_stack_ffffffffffffff38);
      }
      else {
        std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                  ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                   in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
      }
      pUVar4 = (UnitTestFilter *)&in_RDI[3].exact_match_patterns_;
      std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)pUVar4);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)pUVar4,(value_type *)in_stack_fffffffffffffea8
                );
      anon_unknown_35::UnitTestFilter::~UnitTestFilter(pUVar4);
    }
  }
  else {
    std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
              ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
               in_stack_fffffffffffffeb8);
    ppTVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffeb0);
    local_8 = *ppTVar2;
  }
  return local_8;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const std::string& test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // During initialization, all TestInfos for a given suite are added in
  // sequence. To optimize this case, see if the most recently added suite is
  // the one being requested now.
  if (!test_suites_.empty() &&
      (*test_suites_.rbegin())->name_ == test_suite_name) {
    return *test_suites_.rbegin();
  }

  // Fall back to searching the collection.
  auto item_it = test_suites_by_name_.find(test_suite_name);
  if (item_it != test_suites_by_name_.end()) {
    return item_it->second;
  }

  // Not found. Create a new instance.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);
  test_suites_by_name_.emplace(test_suite_name, new_test_suite);

  const UnitTestFilter death_test_suite_filter(kDeathTestSuiteFilter);
  // Is this a death test suite?
  if (death_test_suite_filter.MatchesName(test_suite_name)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}